

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_symmetrizing.cc
# Opt level: O2

int __thiscall
anon_unknown.dwarf_7bad::CalculateDataLength
          (anon_unknown_dwarf_7bad *this,int fft_length,InputOutputFormats format)

{
  int iVar1;
  
  iVar1 = (int)this;
  switch(fft_length) {
  case 0:
    iVar1 = (int)((long)((ulong)(uint)(iVar1 >> 0x1f) << 0x20 | (ulong)this & 0xffffffff) / 2);
switchD_00103902_caseD_2:
    return iVar1 + 1;
  case 1:
    return iVar1;
  case 2:
  case 3:
    goto switchD_00103902_caseD_2;
  default:
    return 0;
  }
}

Assistant:

int CalculateDataLength(int fft_length,
                        sptk::DataSymmetrizing::InputOutputFormats format) {
  switch (format) {
    case sptk::DataSymmetrizing::InputOutputFormats::kStandard: {
      return fft_length / 2 + 1;
    }
    case sptk::DataSymmetrizing::InputOutputFormats::
        kSymmetricForApplyingFourierTransform: {
      return fft_length;
    }
    case sptk::DataSymmetrizing::InputOutputFormats::
        kSymmetricForPreservingFrequencyResponse: {
      return fft_length + 1;
    }
    case sptk::DataSymmetrizing::InputOutputFormats::
        kSymmetricForPlottingFrequencyResponse: {
      return fft_length + 1;
    }
    default: {
      return 0;
    }
  }
}